

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O3

void __thiscall test_suite::detail::simple_runner::~simple_runner(simple_runner *this)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  pointer psVar5;
  long lVar6;
  ostream *poVar7;
  ostream *poVar8;
  
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__simple_runner_0012c450;
  poVar8 = this->log_;
  lVar6 = std::chrono::_V2::steady_clock::now();
  lVar6 = lVar6 - (this->all_).start.__d.__r;
  if (lVar6 < 1000000000) {
    poVar7 = std::ostream::_M_insert<long>((long)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"ms",2);
  }
  else {
    lVar1 = *(long *)poVar8;
    lVar2 = *(long *)(lVar1 + -0x18);
    uVar3 = *(undefined8 *)(poVar8 + lVar2 + 8);
    uVar4 = *(undefined8 *)(poVar8 + lVar2 + 0x10);
    *(uint *)(poVar8 + lVar2 + 0x18) = *(uint *)(poVar8 + lVar2 + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)(poVar8 + *(long *)(lVar1 + -0x18) + 8) = 1;
    poVar7 = std::ostream::_M_insert<double>((double)(lVar6 / 1000000) / 1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s",1);
    lVar6 = *(long *)poVar8;
    *(undefined8 *)(poVar8 + *(long *)(lVar6 + -0x18) + 8) = uVar3;
    *(undefined8 *)(poVar8 + *(long *)(lVar6 + -0x18) + 0x10) = uVar4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," suites, ",9);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," failures, ",0xb);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," total.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  psVar5 = (this->v_).
           super__Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar5 != (pointer)0x0) {
    operator_delete(psVar5,(long)(this->v_).
                                 super__Vector_base<test_suite::detail::simple_runner::summary,_std::allocator<test_suite::detail::simple_runner::summary>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar5);
  }
  (this->super_runner)._vptr_runner = (_func_int **)&PTR__runner_0012c4c0;
  current()::p = (this->super_runner).saved_;
  return;
}

Assistant:

~simple_runner()
  {
    log_ <<
         elapsed{clock_type::now() -
                 all_.start } << ", " <<
         v_.size() << " suites, " <<
         all_.failed.load() << " failures, " <<
         all_.total.load() << " total." <<
         std::endl;
  }